

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall argo::json::json(json *this,string *s)

{
  string *s_local;
  json *this_local;
  
  json_value::json_value((json_value *)&(this->m_value).u_object);
  std::__cxx11::string::string((string *)&this->m_raw_value);
  become_string(this,s);
  return;
}

Assistant:

json::json(const string &s)
{
    become_string(s);
}